

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall ON_Interval::Union(ON_Interval *this,int count,double *t)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  byte local_49;
  double local_40;
  double mx;
  double mn;
  double a;
  double *pdStack_20;
  bool rc;
  double *t_local;
  int count_local;
  ON_Interval *this_local;
  
  a._7_1_ = false;
  pdStack_20 = t;
  t_local._4_4_ = count;
  if (t != (double *)0x0) {
    while( true ) {
      local_49 = 0;
      if (0 < t_local._4_4_) {
        bVar1 = ON_IsValid(*pdStack_20);
        local_49 = bVar1 ^ 0xff;
      }
      if ((local_49 & 1) == 0) break;
      t_local._4_4_ = t_local._4_4_ + -1;
      pdStack_20 = pdStack_20 + 1;
    }
  }
  if ((t_local._4_4_ < 1) || (pdStack_20 == (double *)0x0)) {
    bVar1 = IsEmptyInterval(this);
    if (!bVar1) {
      dVar3 = Min(this);
      dVar4 = Max(this);
      if (((dVar3 <= dVar4) && (bVar1 = ON_IsValid(dVar3), bVar1)) &&
         (bVar1 = ON_IsValid(dVar4), bVar1)) {
        Set(this,dVar3,dVar4);
        a._7_1_ = true;
      }
    }
  }
  else {
    a._7_1_ = IsEmptyInterval(this);
    if (a._7_1_) {
      Set(this,*pdStack_20,*pdStack_20);
      t_local._4_4_ = t_local._4_4_ + -1;
      pdStack_20 = pdStack_20 + 1;
    }
    dVar3 = Min(this);
    local_40 = Max(this);
    while (mx = dVar3, 0 < t_local._4_4_) {
      t_local._4_4_ = t_local._4_4_ + -1;
      pdVar2 = pdStack_20 + 1;
      dVar4 = *pdStack_20;
      bVar1 = ON_IsValid(dVar4);
      dVar3 = mx;
      pdStack_20 = pdVar2;
      if (((bVar1) && (dVar3 = dVar4, mx <= dVar4)) && (dVar3 = mx, local_40 < dVar4)) {
        local_40 = dVar4;
      }
    }
    if (((local_40 < mx) || (bVar1 = ON_IsValid(mx), !bVar1)) ||
       (bVar1 = ON_IsValid(local_40), !bVar1)) {
      this->m_t[0] = EmptyInterval.m_t[0];
      this->m_t[1] = EmptyInterval.m_t[1];
    }
    else {
      Set(this,mx,local_40);
      a._7_1_ = true;
    }
  }
  return a._7_1_;
}

Assistant:

bool ON_Interval::Union(
  int count,
  const double* t
  )
{
  bool rc = false;
  double a, mn, mx;

  if ( 0 != t )
  {
    while ( count > 0 && !ON_IsValid(*t) )
    {
      count--;
      t++;
    }
  }

  if ( count <= 0 || 0 == t )
  {
    // this may be increasing, decreasing, or empty
    if ( !IsEmptyInterval() )
    {
      mn = Min();
      mx = Max();
      if ( mn <= mx && ON_IsValid(mn) && ON_IsValid(mx) )
      {
        Set( mn, mx );
        rc = true;
      }
    }
  }
  else 
  {
    if ( IsEmptyInterval() ) 
    {
      a = *t++;
      Set( a, a );
      count--;
      rc = true;
    }
    mn = Min();
    mx = Max();
    while( count > 0 )
    {
      count--;
      a = *t++;
      if ( ON_IsValid(a) )
      {
        if ( a < mn )
          mn = a;
        else if ( a > mx )
          mx = a;
      }
    }
    if ( mn <= mx && ON_IsValid(mn) && ON_IsValid(mx) )
    {
      Set(mn,mx);
      rc = true;
    }
    else
    {
      *this = ON_Interval::EmptyInterval;
    }
  }
  return rc;
}